

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void do_maximum(void *pA,void *pB,void *pC,Integer nelems,Integer type)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  Integer in_stack_00000038;
  char *in_stack_00000040;
  double x2;
  double x1;
  double temp2;
  double temp1;
  double bImag;
  double bReal;
  double aImag;
  double aReal;
  Integer i;
  undefined8 local_160;
  undefined4 local_158;
  undefined4 local_154;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_88;
  undefined8 local_80;
  long local_30;
  
  switch(in_R8) {
  case 0x3e9:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (*(int *)(in_RDI + local_30 * 4) < *(int *)(in_RSI + local_30 * 4)) {
        local_154 = *(undefined4 *)(in_RSI + local_30 * 4);
      }
      else {
        local_154 = *(undefined4 *)(in_RDI + local_30 * 4);
      }
      *(undefined4 *)(in_RDX + local_30 * 4) = local_154;
    }
    break;
  case 0x3ea:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (*(long *)(in_RDI + local_30 * 8) < *(long *)(in_RSI + local_30 * 8)) {
        local_160 = *(undefined8 *)(in_RSI + local_30 * 8);
      }
      else {
        local_160 = *(undefined8 *)(in_RDI + local_30 * 8);
      }
      *(undefined8 *)(in_RDX + local_30 * 8) = local_160;
    }
    break;
  case 0x3eb:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (*(float *)(in_RDI + local_30 * 4) < *(float *)(in_RSI + local_30 * 4)) {
        local_158 = *(undefined4 *)(in_RSI + local_30 * 4);
      }
      else {
        local_158 = *(undefined4 *)(in_RDI + local_30 * 4);
      }
      *(undefined4 *)(in_RDX + local_30 * 4) = local_158;
    }
    break;
  case 0x3ec:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (*(double *)(in_RDI + local_30 * 8) < *(double *)(in_RSI + local_30 * 8)) {
        local_80 = *(undefined8 *)(in_RSI + local_30 * 8);
      }
      else {
        local_80 = *(undefined8 *)(in_RDI + local_30 * 8);
      }
      *(undefined8 *)(in_RDX + local_30 * 8) = local_80;
    }
    break;
  default:
    pnga_error(in_stack_00000040,in_stack_00000038);
    break;
  case 0x3ee:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      fVar1 = *(float *)(in_RDI + local_30 * 8);
      fVar2 = *(float *)(in_RSI + local_30 * 8);
      fVar3 = *(float *)(in_RDI + 4 + local_30 * 8);
      fVar4 = *(float *)(in_RSI + 4 + local_30 * 8);
      fVar11 = fVar1;
      if (fVar1 < 0.0) {
        fVar11 = -fVar1;
      }
      fVar10 = fVar3;
      if (fVar3 < 0.0) {
        fVar10 = -fVar3;
      }
      if (fVar11 < fVar10) {
        fVar11 = fVar3;
        if (fVar3 < 0.0) {
          fVar11 = -fVar3;
        }
      }
      else {
        fVar11 = fVar1;
        if (fVar1 < 0.0) {
          fVar11 = -fVar1;
        }
      }
      fVar10 = fVar2;
      if (fVar2 < 0.0) {
        fVar10 = -fVar2;
      }
      fVar9 = fVar4;
      if (fVar4 < 0.0) {
        fVar9 = -fVar4;
      }
      if (fVar10 < fVar9) {
        fVar10 = fVar4;
        if (fVar4 < 0.0) {
          fVar10 = -fVar4;
        }
      }
      else {
        fVar10 = fVar2;
        if (fVar2 < 0.0) {
          fVar10 = -fVar2;
        }
      }
      if (fVar10 <= fVar11) {
        fVar10 = fVar11;
      }
      if ((fVar10 != 0.0) || (NAN(fVar10))) {
        fVar10 = 1.0 / fVar10;
        if (fVar1 * fVar10 * fVar1 * fVar10 + fVar3 * fVar10 * fVar3 * fVar10 <=
            fVar2 * fVar10 * fVar2 * fVar10 + fVar4 * fVar10 * fVar4 * fVar10) {
          *(undefined4 *)(in_RDX + local_30 * 8) = *(undefined4 *)(in_RSI + local_30 * 8);
          *(undefined4 *)(in_RDX + 4 + local_30 * 8) = *(undefined4 *)(in_RSI + 4 + local_30 * 8);
        }
        else {
          *(undefined4 *)(in_RDX + local_30 * 8) = *(undefined4 *)(in_RDI + local_30 * 8);
          *(undefined4 *)(in_RDX + 4 + local_30 * 8) = *(undefined4 *)(in_RDI + 4 + local_30 * 8);
        }
      }
      else {
        *(undefined4 *)(in_RDX + local_30 * 8) = *(undefined4 *)(in_RDI + local_30 * 8);
        *(undefined4 *)(in_RDX + 4 + local_30 * 8) = *(undefined4 *)(in_RDI + 4 + local_30 * 8);
      }
    }
    break;
  case 0x3ef:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      dVar5 = *(double *)(in_RDI + local_30 * 0x10);
      dVar6 = *(double *)(in_RSI + local_30 * 0x10);
      dVar7 = *(double *)(in_RDI + local_30 * 0x10 + 8);
      dVar8 = *(double *)(in_RSI + local_30 * 0x10 + 8);
      local_88 = dVar5;
      if (dVar5 < 0.0) {
        local_88 = -dVar5;
      }
      local_98 = dVar7;
      if (dVar7 < 0.0) {
        local_98 = -dVar7;
      }
      if (local_88 < local_98) {
        local_b0 = dVar7;
        if (dVar7 < 0.0) {
          local_b0 = -dVar7;
        }
        local_a8 = local_b0;
      }
      else {
        local_a0 = dVar5;
        if (dVar5 < 0.0) {
          local_a0 = -dVar5;
        }
        local_a8 = local_a0;
      }
      local_b8 = dVar6;
      if (dVar6 < 0.0) {
        local_b8 = -dVar6;
      }
      local_c8 = dVar8;
      if (dVar8 < 0.0) {
        local_c8 = -dVar8;
      }
      if (local_b8 < local_c8) {
        local_e0 = dVar8;
        if (dVar8 < 0.0) {
          local_e0 = -dVar8;
        }
        local_d8 = local_e0;
      }
      else {
        local_d0 = dVar6;
        if (dVar6 < 0.0) {
          local_d0 = -dVar6;
        }
        local_d8 = local_d0;
      }
      if (local_a8 < local_d8) {
        local_e8 = local_d8;
      }
      else {
        local_e8 = local_a8;
      }
      if ((local_e8 != 0.0) || (NAN(local_e8))) {
        local_e8 = 1.0 / local_e8;
        if (dVar5 * local_e8 * dVar5 * local_e8 + dVar7 * local_e8 * dVar7 * local_e8 <=
            dVar6 * local_e8 * dVar6 * local_e8 + dVar8 * local_e8 * dVar8 * local_e8) {
          *(undefined8 *)(in_RDX + local_30 * 0x10) = *(undefined8 *)(in_RSI + local_30 * 0x10);
          *(undefined8 *)(in_RDX + local_30 * 0x10 + 8) =
               *(undefined8 *)(in_RSI + local_30 * 0x10 + 8);
        }
        else {
          *(undefined8 *)(in_RDX + local_30 * 0x10) = *(undefined8 *)(in_RDI + local_30 * 0x10);
          *(undefined8 *)(in_RDX + local_30 * 0x10 + 8) =
               *(undefined8 *)(in_RDI + local_30 * 0x10 + 8);
        }
      }
      else {
        *(undefined8 *)(in_RDX + local_30 * 0x10) = *(undefined8 *)(in_RDI + local_30 * 0x10);
        *(undefined8 *)(in_RDX + local_30 * 0x10 + 8) =
             *(undefined8 *)(in_RDI + local_30 * 0x10 + 8);
      }
    }
  }
  return;
}

Assistant:

static void do_maximum(void *pA, void *pB, void *pC, Integer nelems, Integer type){
  /*
    This routine was modified by DJB to scale components
    so as not to unecessarily overflow.
  */
  Integer i;
  double aReal, aImag, bReal, bImag, temp1, temp2;
  double x1,x2;
  switch(type){
    
  case C_DBL:
    for(i = 0; i<nelems; i++)
      ((double*)pC)[i] = GA_MAX(((double*)pA)[i],((double*)pB)[i]);
    break;
  case C_DCPL:
    for(i = 0; i<nelems; i++) {
      aReal = ((DoubleComplex*)pA)[i].real;
      bReal = ((DoubleComplex*)pB)[i].real;
      aImag = ((DoubleComplex*)pA)[i].imag;
      bImag = ((DoubleComplex*)pB)[i].imag;
      x1    = GA_MAX(GA_ABS(aReal),GA_ABS(aImag));
      x2    = GA_MAX(GA_ABS(bReal),GA_ABS(bImag));
      x1    = GA_MAX(x1,x2);
      if (x1 == (double)0.0) {
	((DoubleComplex*)pC)[i].real=((DoubleComplex*)pA)[i].real;
	((DoubleComplex*)pC)[i].imag=((DoubleComplex*)pA)[i].imag;
      } else {
	x1 = ((double)1.0)/x1;
	aReal = aReal*x1;
	aImag = aImag*x1;
	bReal = bReal*x1;
	bImag = bImag*x1;
	temp1 = (aReal*aReal)+(aImag*aImag);
	temp2 = (bReal*bReal)+(bImag*bImag);
	if(temp1>temp2){
	  ((DoubleComplex*)pC)[i].real=((DoubleComplex*)pA)[i].real;
	  ((DoubleComplex*)pC)[i].imag=((DoubleComplex*)pA)[i].imag;
	}
	else{
	  ((DoubleComplex*)pC)[i].real=((DoubleComplex*)pB)[i].real;
	  ((DoubleComplex*)pC)[i].imag=((DoubleComplex*)pB)[i].imag;
	}
      }
    }
    break;
  case C_SCPL:
    for(i = 0; i<nelems; i++) {
      aReal = ((SingleComplex*)pA)[i].real;
      bReal = ((SingleComplex*)pB)[i].real;
      aImag = ((SingleComplex*)pA)[i].imag;
      bImag = ((SingleComplex*)pB)[i].imag;
      x1    = GA_MAX(GA_ABS(aReal),GA_ABS(aImag));
      x2    = GA_MAX(GA_ABS(bReal),GA_ABS(bImag));
      x1    = GA_MAX(x1,x2);
      if (x1 == (double)0.0) {
	((SingleComplex*)pC)[i].real=((SingleComplex*)pA)[i].real;
	((SingleComplex*)pC)[i].imag=((SingleComplex*)pA)[i].imag;
      } else {
	x1 = ((double)1.0)/x1;
	aReal = aReal*x1;
	aImag = aImag*x1;
	bReal = bReal*x1;
	bImag = bImag*x1;
	temp1 = (aReal*aReal)+(aImag*aImag);
	temp2 = (bReal*bReal)+(bImag*bImag);
	if(temp1>temp2){
	  ((SingleComplex*)pC)[i].real=((SingleComplex*)pA)[i].real;
	  ((SingleComplex*)pC)[i].imag=((SingleComplex*)pA)[i].imag;
	}
	else{
	  ((SingleComplex*)pC)[i].real=((SingleComplex*)pB)[i].real;
	  ((SingleComplex*)pC)[i].imag=((SingleComplex*)pB)[i].imag;
	}
      }
    }
    break;
  case C_INT:
    for(i = 0; i<nelems; i++)
      ((int*)pC)[i] =GA_MAX(((int*)pA)[i],((int*)pB)[i]);
    break;
  case C_FLOAT:
    for(i = 0; i<nelems; i++)
      ((float*)pC)[i]=GA_MAX(((float*)pA)[i],((float*)pB)[i]);
    break;
    
  case C_LONG:
    for(i = 0; i<nelems; i++)
      ((long *)pC)[i]=GA_MAX(((long *)pA)[i],((long *)pB)[i]);
    break;
    
  default: pnga_error(" wrong data type ",type);
  }
}